

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::Shell__GetArgument_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,char *in,int flags)

{
  int iVar1;
  cmOutputConverter *pcVar2;
  char *skip;
  int needQuotes;
  int windows_backslashes;
  char *c;
  int flags_local;
  char *in_local;
  string *out;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  strlen((char *)this);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  skip._4_4_ = 0;
  iVar1 = Shell__ArgumentNeedsQuotes((char *)this,(int)in);
  _needQuotes = this;
  if (iVar1 != 0) {
    if (((ulong)in & 0x80) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
    }
    else {
      if (((ulong)in & 0x100) != 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\'');
    }
  }
  for (; *(char *)&(_needQuotes->StateSnapshot).State != '\0';
      _needQuotes = (cmOutputConverter *)((long)&(_needQuotes->StateSnapshot).State + 1)) {
    if ((((ulong)in & 0x40) != 0) &&
       (pcVar2 = (cmOutputConverter *)Shell__SkipMakeVariables((char *)_needQuotes),
       pcVar2 != _needQuotes)) {
      for (; _needQuotes != pcVar2;
          _needQuotes = (cmOutputConverter *)((long)&(_needQuotes->StateSnapshot).State + 1)) {
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,*(char *)&(_needQuotes->StateSnapshot).State);
      }
      skip._4_4_ = 0;
      if (*(char *)&(_needQuotes->StateSnapshot).State == '\0') break;
    }
    if (((ulong)in & 0x100) == 0) {
      if (((ulong)in & 4) == 0) {
        if (*(char *)&(_needQuotes->StateSnapshot).State == '\\') {
          skip._4_4_ = skip._4_4_ + 1;
        }
        else if (*(char *)&(_needQuotes->StateSnapshot).State == '\"') {
          while (0 < skip._4_4_) {
            skip._4_4_ = skip._4_4_ + -1;
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
          }
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
        }
        else {
          skip._4_4_ = 0;
        }
      }
    }
    else if ((((*(char *)&(_needQuotes->StateSnapshot).State == '\\') ||
              (*(char *)&(_needQuotes->StateSnapshot).State == '\"')) ||
             (*(char *)&(_needQuotes->StateSnapshot).State == '`')) ||
            (*(char *)&(_needQuotes->StateSnapshot).State == '$')) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
    }
    if (*(char *)&(_needQuotes->StateSnapshot).State == '$') {
      if (((ulong)in & 1) == 0) {
        if (((ulong)in & 2) == 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'$');
        }
        else {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"$\"");
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"$$");
      }
    }
    else if (*(char *)&(_needQuotes->StateSnapshot).State == '#') {
      if ((((ulong)in & 1) == 0) || (((ulong)in & 8) == 0)) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'#');
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"$#");
      }
    }
    else if (*(char *)&(_needQuotes->StateSnapshot).State == '%') {
      if ((((ulong)in & 2) == 0) &&
         ((((ulong)in & 1) == 0 || ((((ulong)in & 0x10) == 0 && (((ulong)in & 0x20) == 0)))))) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'%');
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%%");
      }
    }
    else if (*(char *)&(_needQuotes->StateSnapshot).State == ';') {
      if (((ulong)in & 2) == 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\";\"");
      }
    }
    else {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,*(char *)&(_needQuotes->StateSnapshot).State);
    }
  }
  if (iVar1 != 0) {
    while (0 < skip._4_4_) {
      skip._4_4_ = skip._4_4_ + -1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
    }
    if (((ulong)in & 0x80) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\'');
      if (((ulong)in & 0x100) != 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::Shell__GetArgument(const char* in, int flags)
{
  /* Output will be at least as long as input string.  */
  std::string out;
  out.reserve(strlen(in));

  /* String iterator.  */
  const char* c;

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Whether the argument must be quoted.  */
  int needQuotes = Shell__ArgumentNeedsQuotes(in, flags);
  if (needQuotes) {
    /* Add the opening quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      if (flags & Shell_Flag_IsUnix) {
        out += '"';
      }
      out += '\'';
    } else {
      out += '"';
    }
  }

  /* Scan the string for characters that require escaping or quoting.  */
  for (c = in; *c; ++c) {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if (flags & Shell_Flag_AllowMakeVariables) {
      const char* skip = Shell__SkipMakeVariables(c);
      if (skip != c) {
        /* Copy to the end of the make variable references.  */
        while (c != skip) {
          out += *c++;
        }

        /* The make variable reference eliminates any escaping needed
           for preceding backslashes.  */
        windows_backslashes = 0;

        /* Stop if we have reached the end of the string.  */
        if (!*c) {
          break;
        }
      }
    }

    /* Check whether this character needs escaping for the shell.  */
    if (flags & Shell_Flag_IsUnix) {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if (*c == '\\' || *c == '"' || *c == '`' || *c == '$') {
        /* This character needs a backslash to escape it.  */
        out += '\\';
      }
    } else if (flags & Shell_Flag_EchoWindows) {
      /* On Windows the built-in command shell echo never needs escaping.  */
    } else {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if (*c == '\\') {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
      } else if (*c == '"') {
        /* Found a double-quote.  Escape all immediately preceding
           backslashes.  */
        while (windows_backslashes > 0) {
          --windows_backslashes;
          out += '\\';
        }

        /* Add the backslash to escape the double-quote.  */
        out += '\\';
      } else {
        /* We encountered a normal character.  This eliminates any
           escaping needed for preceding backslashes.  */
        windows_backslashes = 0;
      }
    }

    /* Check whether this character needs escaping for a make tool.  */
    if (*c == '$') {
      if (flags & Shell_Flag_Make) {
        /* In Makefiles a dollar is written $$.  The make tool will
           replace it with just $ before passing it to the shell.  */
        out += "$$";
      } else if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a dollar is written "$".  If this is written in
           an un-quoted argument it starts a quoted segment, inserts
           the $ and ends the segment.  If it is written in a quoted
           argument it ends quoting, inserts the $ and restarts
           quoting.  Either way the $ is isolated from surrounding
           text to avoid looking like a variable reference.  */
        out += "\"$\"";
      } else {
        /* Otherwise a dollar is written just $. */
        out += '$';
      }
    } else if (*c == '#') {
      if ((flags & Shell_Flag_Make) && (flags & Shell_Flag_WatcomWMake)) {
        /* In Watcom WMake makefiles a pound is written $#.  The make
           tool will replace it with just # before passing it to the
           shell.  */
        out += "$#";
      } else {
        /* Otherwise a pound is written just #. */
        out += '#';
      }
    } else if (*c == '%') {
      if ((flags & Shell_Flag_VSIDE) ||
          ((flags & Shell_Flag_Make) &&
           ((flags & Shell_Flag_MinGWMake) || (flags & Shell_Flag_NMake)))) {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%.  */
        out += "%%";
      } else {
        /* Otherwise a percent is written just %. */
        out += '%';
      }
    } else if (*c == ';') {
      if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a semicolon is written ";".  If this is written
           in an un-quoted argument it starts a quoted segment,
           inserts the ; and ends the segment.  If it is written in a
           quoted argument it ends quoting, inserts the ; and restarts
           quoting.  Either way the ; is isolated.  */
        out += "\";\"";
      } else {
        /* Otherwise a semicolon is written just ;. */
        out += ';';
      }
    } else {
      /* Store this character.  */
      out += *c;
    }
  }

  if (needQuotes) {
    /* Add enough backslashes to escape any trailing ones.  */
    while (windows_backslashes > 0) {
      --windows_backslashes;
      out += '\\';
    }

    /* Add the closing quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      out += '\'';
      if (flags & Shell_Flag_IsUnix) {
        out += '"';
      }
    } else {
      out += '"';
    }
  }

  return out;
}